

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Real eps;
  Item *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined1 uVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  Item *this_00;
  int j_local;
  int i_local;
  undefined1 local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  uint local_118 [7];
  bool local_fc;
  fpclass_type local_f8;
  int32_t local_f4;
  Item *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  if (-1 < (j | i)) {
    this_00 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[i].idx;
    local_f0 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[j].idx;
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_e8.m_backend.exp = (val->m_backend).exp;
    local_e8.m_backend.neg = (val->m_backend).neg;
    local_e8.m_backend.fpclass = (val->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (val->m_backend).prec_elem;
    j_local = j;
    i_local = i;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_128,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    eps = Tolerances::epsilon((Tolerances *)local_128);
    bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_e8,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_120);
    if (bVar4) {
      local_118[0] = 0;
      local_118[1] = 0;
      local_118[2] = 0;
      local_118[3] = 0;
      local_128 = (undefined1  [8])0x0;
      _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118[4] = 0;
      local_118[5] = 0;
      if (scale) {
        local_88 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
        local_a8 = (val->m_backend).data._M_elems[0];
        uStack_a4 = (val->m_backend).data._M_elems[1];
        uStack_a0 = (val->m_backend).data._M_elems[2];
        uStack_9c = (val->m_backend).data._M_elems[3];
        local_98 = (val->m_backend).data._M_elems[4];
        uStack_94 = (val->m_backend).data._M_elems[5];
        uStack_90 = (val->m_backend).data._M_elems[6];
        uStack_8c = (val->m_backend).data._M_elems[7];
        local_80 = (val->m_backend).exp;
        local_7c = (val->m_backend).neg;
        local_78._0_4_ = (val->m_backend).fpclass;
        local_78._4_4_ = (val->m_backend).prec_elem;
        (*this->lp_scaler->_vptr_SPxScaler[0x2a])(&local_68,this->lp_scaler,this,i,(ulong)(uint)j);
        local_118[4] = local_48[0];
        local_118[5] = local_48[1];
        local_118[0] = local_58[0];
        local_118[1] = local_58[1];
        local_118[2] = auStack_50[0];
        local_118[3] = auStack_50[1];
        local_128 = (undefined1  [8])local_68;
        _Stack_120._M_pi = p_Stack_60;
        iVar5 = local_40;
        uVar8 = local_3c;
        fVar9 = local_38;
        iVar10 = local_34;
      }
      else {
        local_118._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
        local_128 = *(undefined1 (*) [8])(val->m_backend).data._M_elems;
        _Stack_120._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((val->m_backend).data._M_elems + 2);
        local_118._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
        local_118._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
        iVar5 = (val->m_backend).exp;
        uVar8 = (val->m_backend).neg;
        fVar9 = (val->m_backend).fpclass;
        iVar10 = (val->m_backend).prec_elem;
      }
      local_118[6] = iVar5;
      local_fc = (bool)uVar8;
      local_f8 = fVar9;
      local_f4 = iVar10;
      iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this_00,j);
      pIVar3 = local_f0;
      if ((-1 < iVar7) &&
         (iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_f0,i), -1 < iVar7)) {
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_00,j);
        pNVar2 = (this_00->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined1 (*) [8])pNVar2[iVar7].val.m_backend.data._M_elems = local_128;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (pNVar2[iVar7].val.m_backend.data._M_elems + 2) = _Stack_120._M_pi;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_118._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_118._8_8_;
        *(undefined8 *)(pNVar2[iVar7].val.m_backend.data._M_elems + 8) = local_118._16_8_;
        pNVar2[iVar7].val.m_backend.exp = iVar5;
        pNVar2[iVar7].val.m_backend.neg = (bool)uVar8;
        pNVar2[iVar7].val.m_backend.fpclass = fVar9;
        pNVar2[iVar7].val.m_backend.prec_elem = iVar10;
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)pIVar3,i);
        pNVar2 = (pIVar3->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined1 (*) [8])pNVar2[iVar7].val.m_backend.data._M_elems = local_128;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (pNVar2[iVar7].val.m_backend.data._M_elems + 2) = _Stack_120._M_pi;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_118._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_118._8_8_;
        *(undefined8 *)(pNVar2[iVar7].val.m_backend.data._M_elems + 8) = local_118._16_8_;
        pNVar2[iVar7].val.m_backend.exp = iVar5;
        pNVar2[iVar7].val.m_backend.neg = (bool)uVar8;
        pNVar2[iVar7].val.m_backend.fpclass = fVar9;
        pNVar2[iVar7].val.m_backend.prec_elem = iVar10;
        return;
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,i,1,&j_local,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_128);
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,j_local,1,&i_local,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_128);
    }
    else {
      iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this_00,j);
      pIVar3 = local_f0;
      if ((-1 < iVar5) &&
         (iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_f0,i), -1 < iVar5)) {
        uVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_00,j);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)this_00,(char *)(ulong)uVar6);
        uVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)pIVar3,i);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar3,(char *)(ulong)uVar6);
      }
    }
  }
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }